

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::InteractionUniforms2<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (InteractionUniforms2<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  ulong *puVar5;
  TestError *pTVar6;
  long *plVar7;
  size_type *psVar8;
  long lVar9;
  int iVar10;
  int sub_script_entry_index;
  int iVar11;
  bool bVar12;
  string shader_source;
  string base_variable_string;
  string array_initializers [5];
  int local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  long *local_180;
  long local_178;
  long local_170;
  long lStack_168;
  long *local_160;
  long local_158;
  long local_150;
  long lStack_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  long local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_118;
  InteractionUniforms2<glcts::ArraysOfArrays::Interface::ES> *local_110;
  long local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  undefined1 *local_b8 [2];
  undefined1 local_a8 [16];
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_110 = this;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,
             "int[2][2][2][2](\n    int[2][2][2](\n        int[2][2](\n            int[2]( 1,  2),\n            int[2]( 3,  4)\n        ),\n        int[2][2](\n            int[2]( 5,  6),\n            int[2]( 7,  8)\n        )\n    ),\n    int[2][2][2](\n        int[2][2](\n            int[2](11, 12),\n            int[2](13, 14)\n        ),\n        int[2][2](\n            int[2](15, 16),\n            int[2](17, 18)\n        )\n    )\n)"
             ,"");
  local_b8[0] = local_a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b8,
             "float[2][2][2][2](\n    float[2][2][2](\n        float[2][2](\n            float[2](1.0, 2.0),\n            float[2](3.0, 4.0)),\n        float[2][2](\n            float[2](5.0, 6.0),\n            float[2](7.0, 8.0))),\n    float[2][2][2](\n        float[2][2](\n            float[2](1.1, 2.1),\n            float[2](3.1, 4.1)\n        ),\n        float[2][2](\n            float[2](5.1, 6.1),\n            float[2](7.1, 8.1)\n        )\n    )\n)"
             ,"");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,
             "mat4[2][2][2][2](\n    mat4[2][2][2](\n        mat4[2][2](\n            mat4[2]( mat4(1),  mat4(2)),\n            mat4[2]( mat4(3),  mat4(4))\n        ),\n        mat4[2][2](\n            mat4[2](mat4(5),  mat4(6)),\n            mat4[2](mat4(7),  mat4(8))\n        )\n    ),\n    mat4[2][2][2](\n        mat4[2][2](\n            mat4[2](mat4(9),  mat4(10)),\n            mat4[2](mat4(11),  mat4(12))\n        ),\n        mat4[2][2](\n            mat4[2](mat4(13),  mat4(14)),\n            mat4[2](mat4(15),  mat4(16))\n        )\n    )\n)"
             ,"");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_78,
             "double[2][2][2][2](\n    double[2][2][2](\n        double[2][2](\n            double[2](1.0, 2.0),\n            double[2](3.0, 4.0)),\n        double[2][2](\n            double[2](5.0, 6.0),\n            double[2](7.0, 8.0))),\n    double[2][2][2](\n        double[2][2](\n            double[2](1.1, 2.1),\n            double[2](3.1, 4.1)\n        ),\n        double[2][2](\n            double[2](5.1, 6.1),\n            double[2](7.1, 8.1)\n        )\n    )\n)"
             ,"");
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_58,
             "dmat4[2][2][2][2](\n    dmat4[2][2][2](\n        dmat4[2][2](\n            dmat4[2]( dmat4(1),  dmat4(2)),\n            dmat4[2]( dmat4(3),  dmat4(4))\n        ),\n        dmat4[2][2](\n            dmat4[2](dmat4(5),  dmat4(6)),\n            dmat4[2](dmat4(7),  dmat4(8))\n        )\n    ),\n    dmat4[2][2][2](\n        dmat4[2][2](\n            dmat4[2](dmat4(9),   dmat4(10)),\n            dmat4[2](dmat4(11),  dmat4(12))\n        ),\n        dmat4[2][2](\n            dmat4[2](dmat4(13),  dmat4(14)),\n            dmat4[2](dmat4(15),  dmat4(16))\n        )\n    )\n)"
             ,"");
  paVar1 = &local_1a0.field_2;
  lVar9 = 0;
  do {
    lVar2 = 0x222cb38;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar2 = 0x222cb38;
      lVar3 = supported_variable_types_map._16_8_;
      do {
        if ((int)test_shader_compilation::var_types_set_es[lVar9] <= *(int *)(lVar3 + 0x20)) {
          lVar2 = lVar3;
        }
        lVar3 = *(long *)(lVar3 + 0x10 +
                         (ulong)(*(int *)(lVar3 + 0x20) <
                                (int)test_shader_compilation::var_types_set_es[lVar9]) * 8);
      } while (lVar3 != 0);
    }
    lVar3 = 0x222cb38;
    if ((lVar2 != 0x222cb38) &&
       (lVar3 = lVar2,
       (int)test_shader_compilation::var_types_set_es[lVar9] < *(int *)(lVar2 + 0x20))) {
      lVar3 = 0x222cb38;
    }
    if (lVar3 == 0x222cb38) {
      pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar6,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x1ab4);
      __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
    local_140._M_string_length = 0;
    local_140.field_2._M_local_buf[0] = '\0';
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar3 + 0x48);
    local_118 = &local_d8 + lVar9;
    local_1a8 = 1;
    local_120 = lVar9;
    local_108 = lVar3;
    do {
      iVar10 = 0xe;
      do {
        std::operator+(&local_f8,"uniform ",local_100);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_f8);
        local_180 = &local_170;
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_170 = *plVar7;
          lStack_168 = plVar4[3];
        }
        else {
          local_170 = *plVar7;
          local_180 = (long *)*plVar4;
        }
        local_178 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_180,*(ulong *)(local_108 + 0x28));
        local_160 = &local_150;
        plVar7 = plVar4 + 2;
        if ((long *)*plVar4 == plVar7) {
          local_150 = *plVar7;
          lStack_148 = plVar4[3];
        }
        else {
          local_150 = *plVar7;
          local_160 = (long *)*plVar4;
        }
        local_158 = plVar4[1];
        *plVar4 = (long)plVar7;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_160);
        psVar8 = (size_type *)(plVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar4 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar8) {
          local_1a0.field_2._M_allocated_capacity = *psVar8;
          local_1a0.field_2._8_8_ = plVar4[3];
          local_1a0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_1a0.field_2._M_allocated_capacity = *psVar8;
          local_1a0._M_dataplus._M_p = (pointer)*plVar4;
        }
        local_1a0._M_string_length = plVar4[1];
        *plVar4 = (long)psVar8;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_140,(string *)&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if (local_160 != &local_150) {
          operator_delete(local_160,local_150 + 1);
        }
        if (local_180 != &local_170) {
          operator_delete(local_180,local_170 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
          operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
        }
        iVar11 = 3;
        do {
          std::__cxx11::string::append((char *)&local_140);
          bVar12 = iVar11 != 0;
          iVar11 = iVar11 + -1;
        } while (bVar12);
        if (local_1a8 == 0) {
          std::operator+(&local_1a0," = ",local_118);
          std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_1a0._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1a0._M_dataplus._M_p != paVar1) {
            operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::string::append((char *)&local_140);
        std::operator+(&local_1a0,&local_140,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &shader_start_abi_cxx11_);
        if (TESSELATION_EVALUATION_SHADER_TYPE < tested_shader_type) {
          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar6,"Unrecognized shader type.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x1aa1);
          __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        puVar5 = &set_tesseation_abi_cxx11_;
        switch(tested_shader_type) {
        case VERTEX_SHADER_TYPE:
          std::__cxx11::string::append((char *)&local_1a0);
          break;
        case GEOMETRY_SHADER_TYPE:
          puVar5 = &emit_quad_abi_cxx11_;
        case TESSELATION_CONTROL_SHADER_TYPE:
          std::__cxx11::string::_M_append((char *)&local_1a0,*puVar5);
        }
        std::__cxx11::string::_M_append((char *)&local_1a0,shader_end_abi_cxx11_);
        (*(local_110->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
          super_TestNode._vptr_TestNode[8])(local_110,(ulong)tested_shader_type,&local_1a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != paVar1) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        bVar12 = iVar10 != 0;
        iVar10 = iVar10 + -1;
      } while (bVar12);
      bVar12 = local_1a8 != 0;
      local_1a8 = local_1a8 + -1;
    } while (bVar12);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != &local_140.field_2) {
      operator_delete(local_140._M_dataplus._M_p,
                      CONCAT71(local_140.field_2._M_allocated_capacity._1_7_,
                               local_140.field_2._M_local_buf[0]) + 1);
    }
    lVar9 = local_120 + 1;
    if (lVar9 == 3) {
      lVar9 = -0xa0;
      plVar4 = local_48;
      do {
        if (plVar4 != (long *)plVar4[-2]) {
          operator_delete((long *)plVar4[-2],*plVar4 + 1);
        }
        plVar4 = plVar4 + -4;
        lVar9 = lVar9 + 0x20;
      } while (lVar9 != 0);
      return;
    }
  } while( true );
}

Assistant:

void InteractionUniforms2<API>::test_shader_compilation(typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	static const glcts::test_var_type var_types_set_es[] = { VAR_TYPE_INT, VAR_TYPE_FLOAT, VAR_TYPE_MAT4 };
	static const size_t				  num_var_types_es   = sizeof(var_types_set_es) / sizeof(var_types_set_es[0]);

	static const glcts::test_var_type var_types_set_gl[] = { VAR_TYPE_INT, VAR_TYPE_FLOAT, VAR_TYPE_MAT4,
															 VAR_TYPE_DOUBLE, VAR_TYPE_DMAT4 };
	static const size_t num_var_types_gl = sizeof(var_types_set_gl) / sizeof(var_types_set_gl[0]);

	const std::string array_initializers[] = { "int[2][2][2][2](\n"
											   "    int[2][2][2](\n"
											   "        int[2][2](\n"
											   "            int[2]( 1,  2),\n"
											   "            int[2]( 3,  4)\n"
											   "        ),\n"
											   "        int[2][2](\n"
											   "            int[2]( 5,  6),\n"
											   "            int[2]( 7,  8)\n"
											   "        )\n"
											   "    ),\n"
											   "    int[2][2][2](\n"
											   "        int[2][2](\n"
											   "            int[2](11, 12),\n"
											   "            int[2](13, 14)\n"
											   "        ),\n"
											   "        int[2][2](\n"
											   "            int[2](15, 16),\n"
											   "            int[2](17, 18)\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "float[2][2][2][2](\n"
											   "    float[2][2][2](\n"
											   "        float[2][2](\n"
											   "            float[2](1.0, 2.0),\n"
											   "            float[2](3.0, 4.0)),\n"
											   "        float[2][2](\n"
											   "            float[2](5.0, 6.0),\n"
											   "            float[2](7.0, 8.0))),\n"
											   "    float[2][2][2](\n"
											   "        float[2][2](\n"
											   "            float[2](1.1, 2.1),\n"
											   "            float[2](3.1, 4.1)\n"
											   "        ),\n"
											   "        float[2][2](\n"
											   "            float[2](5.1, 6.1),\n"
											   "            float[2](7.1, 8.1)\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "mat4[2][2][2][2](\n"
											   "    mat4[2][2][2](\n"
											   "        mat4[2][2](\n"
											   "            mat4[2]( mat4(1),  mat4(2)),\n"
											   "            mat4[2]( mat4(3),  mat4(4))\n"
											   "        ),\n"
											   "        mat4[2][2](\n"
											   "            mat4[2](mat4(5),  mat4(6)),\n"
											   "            mat4[2](mat4(7),  mat4(8))\n"
											   "        )\n"
											   "    ),\n"
											   "    mat4[2][2][2](\n"
											   "        mat4[2][2](\n"
											   "            mat4[2](mat4(9),  mat4(10)),\n"
											   "            mat4[2](mat4(11),  mat4(12))\n"
											   "        ),\n"
											   "        mat4[2][2](\n"
											   "            mat4[2](mat4(13),  mat4(14)),\n"
											   "            mat4[2](mat4(15),  mat4(16))\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "double[2][2][2][2](\n"
											   "    double[2][2][2](\n"
											   "        double[2][2](\n"
											   "            double[2](1.0, 2.0),\n"
											   "            double[2](3.0, 4.0)),\n"
											   "        double[2][2](\n"
											   "            double[2](5.0, 6.0),\n"
											   "            double[2](7.0, 8.0))),\n"
											   "    double[2][2][2](\n"
											   "        double[2][2](\n"
											   "            double[2](1.1, 2.1),\n"
											   "            double[2](3.1, 4.1)\n"
											   "        ),\n"
											   "        double[2][2](\n"
											   "            double[2](5.1, 6.1),\n"
											   "            double[2](7.1, 8.1)\n"
											   "        )\n"
											   "    )\n"
											   ")",

											   "dmat4[2][2][2][2](\n"
											   "    dmat4[2][2][2](\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2]( dmat4(1),  dmat4(2)),\n"
											   "            dmat4[2]( dmat4(3),  dmat4(4))\n"
											   "        ),\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2](dmat4(5),  dmat4(6)),\n"
											   "            dmat4[2](dmat4(7),  dmat4(8))\n"
											   "        )\n"
											   "    ),\n"
											   "    dmat4[2][2][2](\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2](dmat4(9),   dmat4(10)),\n"
											   "            dmat4[2](dmat4(11),  dmat4(12))\n"
											   "        ),\n"
											   "        dmat4[2][2](\n"
											   "            dmat4[2](dmat4(13),  dmat4(14)),\n"
											   "            dmat4[2](dmat4(15),  dmat4(16))\n"
											   "        )\n"
											   "    )\n"
											   ")" };

	const glcts::test_var_type* var_types_set = var_types_set_es;
	size_t						num_var_types = num_var_types_es;

	if (API::USE_DOUBLE)
	{
		var_types_set = var_types_set_gl;
		num_var_types = num_var_types_gl;
	}

	for (size_t var_type_index = 0; var_type_index < num_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(var_types_set[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			std::string base_variable_string;

			for (int initialiser_selector = 1; initialiser_selector >= 0; initialiser_selector--)
			{
				// We normally do all 16 possible permutations of [4][4][4][4] items (15..0).
				// However, in this case we will skip the case that will work,
				// so we'll merely process permutations 14..0
				for (int permutation_index = 14; permutation_index >= 0; permutation_index--)
				{
					base_variable_string =
						"uniform " + var_iterator->second.precision + " " + var_iterator->second.type + " x";

					// for all 4 possible sub_script entries
					for (int sub_script_entry_index = 3; sub_script_entry_index >= 0; sub_script_entry_index--)
					{
						if (permutation_index & (1 << sub_script_entry_index))
						{
							// In this case, we'll use a valid sub_script
							base_variable_string += "[2]";
						}
						else
						{
							// In this case, we'll use an invalid sub_script
							base_variable_string += "[]";
						}
					}

					if (initialiser_selector == 0)
					{
						// We'll use an initialiser
						base_variable_string += " = " + array_initializers[var_type_index];
					}

					base_variable_string += ";\n\n";

					std::string shader_source = base_variable_string + shader_start;

					/* End main */
					DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

					/* Execute test:
					 *
					 * This will succeed in case of allowed unsized
					 * declarations and when at least one of these is
					 * true:
					 *   1. There is an initialiser.
					 *   2. Only the outermost dimension is unsized,
					 *      as in [][2][2][2].
					 */
					EXECUTE_SHADER_TEST(API::ALLOW_UNSIZED_DECLARATION &&
											(initialiser_selector == 0 || permutation_index == 7),
										tested_shader_type, shader_source);
				} /* for (int permutation_index = 14; ...) */
			}	 /* for (int initialiser_selector  = 1; ...) */
		}		  /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}